

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v5::internal::
       parse_width<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
                 *handler)

{
  char cVar1;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
  *in_RAX;
  uint uVar2;
  char *begin_00;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
  local_28;
  
  if (begin == end) {
    __assert_fail("(begin != end) && \"\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/format.h"
                  ,0x75e,
                  "const Char *fmt::internal::parse_width(const Char *, const Char *, Handler &&) [Char = char, Handler = fmt::internal::specs_checker<fmt::internal::specs_handler<fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<char>>, char>>> &]"
                 );
  }
  cVar1 = *begin;
  if ((byte)(cVar1 - 0x30U) < 10) {
    if (9 < (byte)(cVar1 - 0x30U)) {
      __assert_fail("begin != end && \'0\' <= *begin && *begin <= \'9\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/format.h"
                    ,0x5b0,
                    "unsigned int fmt::internal::parse_nonnegative_int(const Char *&, const Char *, ErrorHandler &&) [Char = char, ErrorHandler = fmt::internal::specs_checker<fmt::internal::specs_handler<fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<char>>, char>>> &]"
                   );
    }
    begin = begin + 1;
    uVar2 = 0;
    if (cVar1 != '0') {
      do {
        if (0xccccccc < uVar2) {
          uVar2 = 0x80000000;
          break;
        }
        uVar2 = ((int)begin[-1] + uVar2 * 10) - 0x30;
        if (begin == end) goto LAB_00195516;
        cVar1 = *begin;
        begin = begin + 1;
      } while ((byte)(cVar1 - 0x30U) < 10);
      end = begin + -1;
LAB_00195516:
      begin = end;
      if ((int)uVar2 < 0) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ).context_,"number is too big");
      }
    }
    (((handler->
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ).super_specs_setter<char>.specs_)->super_align_spec).width_ = uVar2;
  }
  else if (cVar1 == '{') {
    begin_00 = begin + 1;
    local_28.handler = in_RAX;
    if (begin_00 != end) {
      local_28.handler = handler;
      begin_00 = parse_arg_id<char,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
                           (begin_00,end,&local_28);
    }
    if ((begin_00 == end) || (*begin_00 != '}')) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 ).context_,"invalid format string");
    }
    begin = begin_00 + 1;
  }
  return begin;
}

Assistant:

FMT_CONSTEXPR const Char *parse_width(
    const Char *begin, const Char *end, Handler &&handler) {
  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    handler.on_width(parse_nonnegative_int(begin, end, handler));
  } else if (*begin == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, width_adapter<Handler, Char>(handler));
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}